

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetAddressesFromMultisigResponse::ConvertFromStruct
          (GetAddressesFromMultisigResponse *this,GetAddressesFromMultisigResponseStruct *data)

{
  GetAddressesFromMultisigResponseStruct *data_local;
  GetAddressesFromMultisigResponse *this_local;
  
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->addresses_,&data->addresses);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->pubkeys_,&data->pubkeys);
  this->require_num_ = data->require_num;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetAddressesFromMultisigResponse::ConvertFromStruct(
    const GetAddressesFromMultisigResponseStruct& data) {
  addresses_.ConvertFromStruct(data.addresses);
  pubkeys_.ConvertFromStruct(data.pubkeys);
  require_num_ = data.require_num;
  ignore_items = data.ignore_items;
}